

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O1

Color * __thiscall
RayTracer::m_rayTraceing
          (Color *__return_storage_ptr__,RayTracer *this,Vector3 *start,Vector3 *dir,double weight,
          int depth)

{
  double dVar1;
  Color ret;
  Collision coll;
  Color local_d8;
  Color local_c0;
  Collision local_a8;
  
  if ((0.05 <= weight) &&
     (Scene::findNearestCollision(&local_a8,this->m_scene,start,dir), local_a8.dist < 1000000000.0))
  {
    if ((Scene *)local_a8.light != (Scene *)0x0) goto LAB_00102d9f;
    if (depth < 0xb) {
      local_d8.r = 0.0;
      local_d8.g = 0.0;
      local_d8.b = 0.0;
      if ((1e-06 < (local_a8.object)->m_material->diff) ||
         (1e-06 < (local_a8.object)->m_material->spec)) {
        m_calcLocalIllumination(&local_c0,this,&local_a8,(local_a8.object)->m_material);
        Color::operator+=(&local_d8,&local_c0);
      }
      if (1e-06 < (local_a8.object)->m_material->refl) {
        m_calcReflection(&local_c0,this,&local_a8,(local_a8.object)->m_material,weight,depth);
        Color::operator+=(&local_d8,&local_c0);
      }
      if (1e-06 < (local_a8.object)->m_material->refr) {
        m_calcRefraction(&local_c0,this,&local_a8,(local_a8.object)->m_material,weight,depth);
        Color::operator+=(&local_d8,&local_c0);
      }
      Color::confine(&local_d8);
      return __return_storage_ptr__;
    }
  }
  local_a8.light = (Light *)this->m_scene;
LAB_00102d9f:
  __return_storage_ptr__->b = (((Scene *)local_a8.light)->m_ambient_color).b;
  dVar1 = (((Scene *)local_a8.light)->m_ambient_color).g;
  __return_storage_ptr__->r = (((Scene *)local_a8.light)->m_ambient_color).r;
  __return_storage_ptr__->g = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_rayTraceing(const Vector3& start, const Vector3& dir, double weight, int depth) const
{
    if (weight < MIN_WEIGHT) return m_scene->getAmbientLightColor();
    Collision coll = m_scene->findNearestCollision(start, dir);
    if (!coll.isHit())
        return m_scene->getAmbientLightColor();
    else if (coll.atLight())
        return coll.light->getColor();
    else if (depth <= MAX_DEPTH)
    {
        Color ret;
        const Object* obj = coll.object;
        if (obj->getMaterial()->diff > Const::EPS || obj->getMaterial()->spec > Const::EPS)
            ret += m_calcLocalIllumination(coll, obj->getMaterial());
        if (obj->getMaterial()->refl > Const::EPS)
            ret += m_calcReflection(coll, obj->getMaterial(), weight, depth);
        if (obj->getMaterial()->refr > Const::EPS)
            ret += m_calcRefraction(coll, obj->getMaterial(), weight, depth);

        return ret.confine();
    }
    else
        return m_scene->getAmbientLightColor();
}